

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMDataProviders.cpp
# Opt level: O0

AtmosSyncDataProvider * __thiscall
ASDCP::AtmosSyncDataProvider::PutSample
          (AtmosSyncDataProvider *this,ui32_t numChannels,byte_t *buf,ui32_t *bytesWritten)

{
  ILogSink *this_00;
  undefined4 in_register_00000034;
  long lVar1;
  undefined4 *in_R8;
  ui32_t *bytesWritten_local;
  byte_t *buf_local;
  ui32_t numChannels_local;
  AtmosSyncDataProvider *this_local;
  
  lVar1 = CONCAT44(in_register_00000034,numChannels);
  if (bytesWritten == (ui32_t *)0x0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PTR);
  }
  else if (*(long *)(lVar1 + 0x110) == 0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PTR);
  }
  else if (*(uint *)(lVar1 + 0xf4) < (uint)buf) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (this_00,"Requested %u channels from a wav file with %u channel.",
               (ulong)buf & 0xffffffff,(ulong)*(uint *)(lVar1 + 0xf4));
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_FAIL);
  }
  else {
    *in_R8 = *(undefined4 *)(lVar1 + 0x118);
    memcpy(bytesWritten,*(void **)(lVar1 + 0x110),(ulong)*(uint *)(lVar1 + 0x118));
    *(ulong *)(lVar1 + 0x110) = *(long *)(lVar1 + 0x110) + (ulong)*(uint *)(lVar1 + 0x118);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  }
  return this;
}

Assistant:

Result_t
ASDCP::AtmosSyncDataProvider::PutSample(const ui32_t numChannels, byte_t* buf, ui32_t* bytesWritten)
{
  ASDCP_TEST_NULL(buf);
  ASDCP_TEST_NULL(m_ptr);
  if ( numChannels > m_ADesc.ChannelCount)
  {
    DefaultLogSink().Error("Requested %u channels from a wav file with %u channel.", numChannels,
                           m_ADesc.ChannelCount);
    return RESULT_FAIL;
  }

  (*bytesWritten) = m_SampleSize;
  ::memcpy(buf, m_ptr, m_SampleSize);
  m_ptr += m_SampleSize;
  return RESULT_OK;
}